

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::STA_ID_X(CPU *this)

{
  uint16_t uVar1;
  int iVar2;
  
  this->cycles = 6;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  uVar1 = ReadWord(this,(ushort)this->X + ((ushort)iVar2 & 0xff));
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)uVar1,(ulong)this->A);
  this->cycles = this->cycles - 2;
  return;
}

Assistant:

void CPU::STA_ID_X()
{
    cycles = 6;
    WriteByte(ReadWord((uint16_t)(GetByte() + X)), A);
    cycles--;
}